

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

Type * __thiscall
choc::value::Type::ComplexArray::getUniformType(Type *__return_storage_ptr__,ComplexArray *this)

{
  if ((this->groups).size == 1) {
    Type(__return_storage_ptr__,&((this->groups).items)->elementType);
    return __return_storage_ptr__;
  }
  throwError("This array does not contain a single element type");
}

Assistant:

Type getUniformType() const
    {
        check (groups.size == 1, "This array does not contain a single element type");
        return groups.front().elementType;
    }